

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O0

ssize_t __thiscall DNSResolver::send(DNSResolver *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int __fd_00;
  size_t sVar1;
  ssize_t sVar2;
  DNSResolver *pDVar3;
  DNSResolver *this_local;
  
  __fd_00 = this->sockfd;
  sVar1 = strlen((char *)this->qname);
  sVar2 = ::send(__fd_00,this,sVar1 + 0x11,0);
  if (sVar2 < 0) {
    pDVar3 = (DNSResolver *)__errno_location();
    if (*(int *)pDVar3->buf != 0xb) {
      this->drop = true;
      pDVar3 = this;
    }
  }
  else {
    this->requestSended = true;
    pDVar3 = this;
  }
  return (ssize_t)pDVar3;
}

Assistant:

void DNSResolver::send() {
    if (::send(sockfd, (char *) buf,
               sizeof(struct DNS_HEADER) + (strlen((const char *) qname) + 1) + sizeof(struct QUESTION), 0) < 0) {
        if (errno != EWOULDBLOCK) {
            drop = true;
        }
        return;
    }
    requestSended = true;
}